

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwidgettextcontrol_p.cpp
# Opt level: O0

void QWidgetTextControl::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QFlagsStorage<Qt::TextInteractionFlag> QVar2;
  QWidgetTextControlPrivate *this;
  QtMocHelpers *in_RCX;
  EVP_PKEY_CTX *in_RDX;
  int iVar3;
  EVP_PKEY_CTX *in_RSI;
  QWidgetTextControl *in_RDI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QWidgetTextControl *_t;
  QVariant _r;
  QRectF *in_stack_fffffffffffffe48;
  QWidgetTextControlPrivate *in_stack_fffffffffffffe50;
  QWidgetTextControl *in_stack_fffffffffffffe58;
  Mode mode;
  undefined8 in_stack_fffffffffffffe70;
  QFlagsStorage<Qt::TextInteractionFlag> *pQVar4;
  int width;
  code *in_stack_fffffffffffffe78;
  QWidgetTextControl *in_stack_fffffffffffffe80;
  QRectF local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  width = (int)((ulong)in_stack_fffffffffffffe70 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (int)in_RSI;
  if (iVar3 == 0) {
    this = (QWidgetTextControlPrivate *)((ulong)in_RDX & 0xffffffff);
    bVar1 = SUB81((ulong)in_stack_fffffffffffffe48 >> 0x38,0);
    mode = (Mode)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    switch(this) {
    case (QWidgetTextControlPrivate *)0x0:
      textChanged((QWidgetTextControl *)0x721c11);
      break;
    case (QWidgetTextControlPrivate *)0x1:
      undoAvailable((QWidgetTextControl *)0x721c36,bVar1);
      break;
    case (QWidgetTextControlPrivate *)0x2:
      redoAvailable((QWidgetTextControl *)0x721c5b,bVar1);
      break;
    case (QWidgetTextControlPrivate *)0x3:
      currentCharFormatChanged
                ((QWidgetTextControl *)in_stack_fffffffffffffe50,
                 (QTextCharFormat *)in_stack_fffffffffffffe48);
      break;
    case (QWidgetTextControlPrivate *)0x4:
      copyAvailable((QWidgetTextControl *)0x721c9e,bVar1);
      break;
    case (QWidgetTextControlPrivate *)0x5:
      selectionChanged((QWidgetTextControl *)0x721cb0);
      break;
    case (QWidgetTextControlPrivate *)0x6:
      cursorPositionChanged((QWidgetTextControl *)0x721cc2);
      break;
    case (QWidgetTextControlPrivate *)0x7:
      updateRequest((QWidgetTextControl *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      break;
    case (QWidgetTextControlPrivate *)0x8:
      QRectF::QRectF(&local_48);
      updateRequest((QWidgetTextControl *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      in_stack_fffffffffffffe58 = in_RDI;
      break;
    case (QWidgetTextControlPrivate *)0x9:
      documentSizeChanged((QWidgetTextControl *)in_stack_fffffffffffffe50,
                          (QSizeF *)in_stack_fffffffffffffe48);
      break;
    case (QWidgetTextControlPrivate *)0xa:
      blockCountChanged((QWidgetTextControl *)0x721d4f,
                        (int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
      break;
    case (QWidgetTextControlPrivate *)0xb:
      visibilityRequest((QWidgetTextControl *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      break;
    case (QWidgetTextControlPrivate *)0xc:
      microFocusChanged((QWidgetTextControl *)0x721d7f);
      break;
    case (QWidgetTextControlPrivate *)0xd:
      linkActivated((QWidgetTextControl *)in_stack_fffffffffffffe50,
                    (QString *)in_stack_fffffffffffffe48);
      break;
    case (QWidgetTextControlPrivate *)0xe:
      linkHovered((QWidgetTextControl *)in_stack_fffffffffffffe50,
                  (QString *)in_stack_fffffffffffffe48);
      break;
    case (QWidgetTextControlPrivate *)0xf:
      blockMarkerHovered((QWidgetTextControl *)in_stack_fffffffffffffe50,
                         (QTextBlock *)in_stack_fffffffffffffe48);
      break;
    case (QWidgetTextControlPrivate *)0x10:
      modificationChanged((QWidgetTextControl *)0x721dfe,bVar1);
      break;
    case (QWidgetTextControlPrivate *)0x11:
      setPlainText((QWidgetTextControl *)in_stack_fffffffffffffe50,
                   (QString *)in_stack_fffffffffffffe48);
      break;
    case (QWidgetTextControlPrivate *)0x12:
      setMarkdown((QWidgetTextControl *)in_stack_fffffffffffffe50,
                  (QString *)in_stack_fffffffffffffe48);
      break;
    case (QWidgetTextControlPrivate *)0x13:
      setHtml((QWidgetTextControl *)in_stack_fffffffffffffe50,(QString *)in_stack_fffffffffffffe48);
      break;
    case (QWidgetTextControlPrivate *)0x14:
      cut((QWidgetTextControl *)this);
      break;
    case (QWidgetTextControlPrivate *)0x15:
      copy(in_RDI,in_RSI,in_RDX);
      break;
    case (QWidgetTextControlPrivate *)0x16:
      paste((QWidgetTextControl *)this,mode);
      break;
    case (QWidgetTextControlPrivate *)0x17:
      paste((QWidgetTextControl *)this,mode);
      break;
    case (QWidgetTextControlPrivate *)0x18:
      undo((QWidgetTextControl *)this);
      break;
    case (QWidgetTextControlPrivate *)0x19:
      redo((QWidgetTextControl *)this);
      break;
    case (QWidgetTextControlPrivate *)0x1a:
      clear((QWidgetTextControl *)this);
      break;
    case (QWidgetTextControlPrivate *)0x1b:
      selectAll(in_stack_fffffffffffffe80);
      break;
    case (QWidgetTextControlPrivate *)0x1c:
      insertPlainText((QWidgetTextControl *)in_stack_fffffffffffffe50,
                      (QString *)in_stack_fffffffffffffe48);
      break;
    case (QWidgetTextControlPrivate *)0x1d:
      insertHtml((QWidgetTextControl *)in_stack_fffffffffffffe50,
                 (QString *)in_stack_fffffffffffffe48);
      break;
    case (QWidgetTextControlPrivate *)0x1e:
      append((QWidgetTextControl *)in_stack_fffffffffffffe50,(QString *)in_stack_fffffffffffffe48);
      break;
    case (QWidgetTextControlPrivate *)0x1f:
      appendHtml((QWidgetTextControl *)in_stack_fffffffffffffe50,
                 (QString *)in_stack_fffffffffffffe48);
      break;
    case (QWidgetTextControlPrivate *)0x20:
      appendPlainText((QWidgetTextControl *)in_stack_fffffffffffffe50,
                      (QString *)in_stack_fffffffffffffe48);
      break;
    case (QWidgetTextControlPrivate *)0x21:
      adjustSize((QWidgetTextControl *)in_stack_fffffffffffffe50);
      break;
    case (QWidgetTextControlPrivate *)0x22:
      d_func((QWidgetTextControl *)0x721fb2);
      QWidgetTextControlPrivate::_q_deleteSelected(in_stack_fffffffffffffe50);
      break;
    case (QWidgetTextControlPrivate *)0x23:
      d_func((QWidgetTextControl *)0x721fcc);
      QWidgetTextControlPrivate::_q_copyLink(this);
      break;
    case (QWidgetTextControlPrivate *)0x24:
      local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(*(long *)in_RDI + 0x68))(&local_28,in_RDI,**(undefined4 **)(in_RCX + 8));
      if (*(long *)in_RCX != 0) {
        ::QVariant::operator=
                  ((QVariant *)in_stack_fffffffffffffe58,(QVariant *)in_stack_fffffffffffffe50);
      }
      ::QVariant::~QVariant((QVariant *)&local_28);
    }
  }
  if (iVar3 == 5) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)()>
                      (in_RCX,(void **)textChanged,0,0);
    if (((((bVar1) ||
          (bVar1 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(bool)>
                             (in_RCX,(void **)undoAvailable,0,1), bVar1)) ||
         (bVar1 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(bool)>
                            (in_RCX,(void **)redoAvailable,0,2), bVar1)) ||
        (((bVar1 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(QTextCharFormat_const&)>
                             (in_RCX,(void **)currentCharFormatChanged,0,3), bVar1 ||
          (bVar1 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(bool)>
                             (in_RCX,(void **)copyAvailable,0,4), bVar1)) ||
         ((bVar1 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)()>
                             (in_RCX,(void **)selectionChanged,0,5), bVar1 ||
          ((bVar1 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)()>
                              (in_RCX,(void **)cursorPositionChanged,0,6), bVar1 ||
           (bVar1 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(QRectF_const&)>
                              (in_RCX,(void **)updateRequest,0,7), bVar1)))))))) ||
       ((bVar1 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(QSizeF_const&)>
                           (in_RCX,(void **)documentSizeChanged,0,9), bVar1 ||
        (((((bVar1 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(int)>
                               (in_RCX,(void **)blockCountChanged,0,10), bVar1 ||
            (bVar1 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(QRectF_const&)>
                               (in_RCX,(void **)visibilityRequest,0,0xb), bVar1)) ||
           (bVar1 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)()>
                              (in_RCX,(void **)microFocusChanged,0,0xc), bVar1)) ||
          ((bVar1 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(QString_const&)>
                              (in_RCX,(void **)linkActivated,0,0xd), bVar1 ||
           (bVar1 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(QString_const&)>
                              (in_RCX,(void **)linkHovered,0,0xe), bVar1)))) ||
         (bVar1 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(QTextBlock_const&)>
                            (in_RCX,(void **)blockMarkerHovered,0,0xf), bVar1))))))
    goto switchD_00722646_default;
    in_stack_fffffffffffffe78 = modificationChanged;
    bVar1 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(bool)>
                      (in_RCX,(void **)modificationChanged,0,0x10);
    if (bVar1) goto switchD_00722646_default;
  }
  if (iVar3 == 1) {
    pQVar4 = *(QFlagsStorage<Qt::TextInteractionFlag> **)in_RCX;
    in_stack_fffffffffffffe50 = (QWidgetTextControlPrivate *)((ulong)in_RDX & 0xffffffff);
    switch(in_stack_fffffffffffffe50) {
    case (QWidgetTextControlPrivate *)0x0:
      toHtml((QWidgetTextControl *)in_stack_fffffffffffffe58);
      QString::operator=((QString *)in_stack_fffffffffffffe50,(QString *)in_stack_fffffffffffffe48);
      QString::~QString((QString *)0x72254d);
      break;
    case (QWidgetTextControlPrivate *)0x1:
      bVar1 = overwriteMode((QWidgetTextControl *)in_stack_fffffffffffffe50);
      *(bool *)&pQVar4->i = bVar1;
      break;
    case (QWidgetTextControlPrivate *)0x2:
      bVar1 = acceptRichText((QWidgetTextControl *)in_stack_fffffffffffffe50);
      *(bool *)&pQVar4->i = bVar1;
      break;
    case (QWidgetTextControlPrivate *)0x3:
      QVar2.i = cursorWidth((QWidgetTextControl *)in_stack_fffffffffffffe58);
      pQVar4->i = QVar2.i;
      break;
    case (QWidgetTextControlPrivate *)0x4:
      QVar2.i = (Int)textInteractionFlags((QWidgetTextControl *)in_stack_fffffffffffffe50);
      pQVar4->i = QVar2.i;
      break;
    case (QWidgetTextControlPrivate *)0x5:
      bVar1 = openExternalLinks((QWidgetTextControl *)in_stack_fffffffffffffe50);
      *(bool *)&pQVar4->i = bVar1;
      break;
    case (QWidgetTextControlPrivate *)0x6:
      bVar1 = ignoreUnusedNavigationEvents((QWidgetTextControl *)in_stack_fffffffffffffe50);
      *(bool *)&pQVar4->i = bVar1;
    }
    width = (int)((ulong)pQVar4 >> 0x20);
  }
  if (iVar3 == 2) {
    switch((QString *)((ulong)in_RDX & 0xffffffff)) {
    case (QString *)0x0:
      setHtml((QWidgetTextControl *)in_stack_fffffffffffffe50,
              (QString *)((ulong)in_RDX & 0xffffffff));
      break;
    case (QString *)0x1:
      setOverwriteMode((QWidgetTextControl *)in_stack_fffffffffffffe50,false);
      break;
    case (QString *)0x2:
      setAcceptRichText((QWidgetTextControl *)in_stack_fffffffffffffe50,false);
      break;
    case (QString *)0x3:
      setCursorWidth((QWidgetTextControl *)in_stack_fffffffffffffe78,width);
      break;
    case (QString *)0x4:
      setTextInteractionFlags
                ((QWidgetTextControl *)in_stack_fffffffffffffe58,
                 (QFlagsStorageHelper<Qt::TextInteractionFlag,_4>)
                 SUB84((ulong)*(undefined8 *)in_RCX >> 0x20,0));
      break;
    case (QString *)0x5:
      setOpenExternalLinks((QWidgetTextControl *)in_stack_fffffffffffffe50,false);
      break;
    case (QString *)0x6:
      setIgnoreUnusedNavigationEvents((QWidgetTextControl *)in_stack_fffffffffffffe50,false);
    }
  }
switchD_00722646_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControl::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWidgetTextControl *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->textChanged(); break;
        case 1: _t->undoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->redoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->currentCharFormatChanged((*reinterpret_cast< std::add_pointer_t<QTextCharFormat>>(_a[1]))); break;
        case 4: _t->copyAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->selectionChanged(); break;
        case 6: _t->cursorPositionChanged(); break;
        case 7: _t->updateRequest((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 8: _t->updateRequest(); break;
        case 9: _t->documentSizeChanged((*reinterpret_cast< std::add_pointer_t<QSizeF>>(_a[1]))); break;
        case 10: _t->blockCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 11: _t->visibilityRequest((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 12: _t->microFocusChanged(); break;
        case 13: _t->linkActivated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 14: _t->linkHovered((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 15: _t->blockMarkerHovered((*reinterpret_cast< std::add_pointer_t<QTextBlock>>(_a[1]))); break;
        case 16: _t->modificationChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 17: _t->setPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 18: _t->setMarkdown((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 19: _t->setHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 20: _t->cut(); break;
        case 21: _t->copy(); break;
        case 22: _t->paste((*reinterpret_cast< std::add_pointer_t<QClipboard::Mode>>(_a[1]))); break;
        case 23: _t->paste(); break;
        case 24: _t->undo(); break;
        case 25: _t->redo(); break;
        case 26: _t->clear(); break;
        case 27: _t->selectAll(); break;
        case 28: _t->insertPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 29: _t->insertHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 30: _t->append((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 31: _t->appendHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 32: _t->appendPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 33: _t->adjustSize(); break;
        case 34: _t->d_func()->_q_deleteSelected(); break;
        case 35: _t->d_func()->_q_copyLink(); break;
        case 36: { QVariant _r = _t->loadResource((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)()>(_a, &QWidgetTextControl::textChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(bool )>(_a, &QWidgetTextControl::undoAvailable, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(bool )>(_a, &QWidgetTextControl::redoAvailable, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QTextCharFormat & )>(_a, &QWidgetTextControl::currentCharFormatChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(bool )>(_a, &QWidgetTextControl::copyAvailable, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)()>(_a, &QWidgetTextControl::selectionChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)()>(_a, &QWidgetTextControl::cursorPositionChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QRectF & )>(_a, &QWidgetTextControl::updateRequest, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QSizeF & )>(_a, &QWidgetTextControl::documentSizeChanged, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(int )>(_a, &QWidgetTextControl::blockCountChanged, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QRectF & )>(_a, &QWidgetTextControl::visibilityRequest, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)()>(_a, &QWidgetTextControl::microFocusChanged, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QString & )>(_a, &QWidgetTextControl::linkActivated, 13))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QString & )>(_a, &QWidgetTextControl::linkHovered, 14))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QTextBlock & )>(_a, &QWidgetTextControl::blockMarkerHovered, 15))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(bool )>(_a, &QWidgetTextControl::modificationChanged, 16))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->toHtml(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->overwriteMode(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->acceptRichText(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->cursorWidth(); break;
        case 4: *reinterpret_cast<Qt::TextInteractionFlags*>(_v) = _t->textInteractionFlags(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->openExternalLinks(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->ignoreUnusedNavigationEvents(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setHtml(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setOverwriteMode(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setAcceptRichText(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setCursorWidth(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setTextInteractionFlags(*reinterpret_cast<Qt::TextInteractionFlags*>(_v)); break;
        case 5: _t->setOpenExternalLinks(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setIgnoreUnusedNavigationEvents(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}